

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O3

void __thiscall
Test::Suite::testFailed
          (Suite *this,char *fileName,uint32_t lineNumber,string *errorMessage,string *userMessage)

{
  AssertionFailedException *this_00;
  undefined1 auStack_d8 [64];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [40];
  
  Assertion::Assertion((Assertion *)auStack_d8,fileName,lineNumber,errorMessage,userMessage);
  testFailed(this,(Assertion *)auStack_d8);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)(auStack_d8 + 0x20));
  std::__cxx11::string::~string((string *)auStack_d8);
  if (this->continueAfterFail != false) {
    return;
  }
  this_00 = (AssertionFailedException *)__cxa_allocate_exception(0x10);
  AssertionFailedException::AssertionFailedException(this_00);
  __cxa_throw(this_00,&AssertionFailedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Suite::testFailed(
    const char *fileName, uint32_t lineNumber, std::string &&errorMessage, const std::string &userMessage) {
  testFailed(Assertion(fileName, lineNumber, errorMessage, userMessage));
  if (!continueAfterFailure())
    throw AssertionFailedException{};
}